

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O0

void __thiscall btLCP::solve1(btLCP *this,btScalar *a,int i,int dir,int only_transfer)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  btScalar *B;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int j_4;
  int nC_4;
  btScalar *tmp_2;
  int *C_2;
  int j_3;
  int nC_3;
  btScalar *tmp_1;
  int *C_1;
  int j_2;
  int nC_2;
  btScalar *ell_1;
  btScalar *tmp;
  int j_1;
  int nC_1;
  btScalar *d;
  btScalar *Dell_1;
  btScalar *ell;
  int nC;
  int j;
  int nub;
  btScalar *aptr;
  int *C;
  btScalar *Dell;
  int local_b0;
  int local_98;
  int local_80;
  int local_68;
  int local_40;
  
  if (0 < *(int *)(in_RDI + 0xc)) {
    lVar2 = *(long *)(in_RDI + 0x58);
    lVar3 = *(long *)(in_RDI + 0x88);
    lVar4 = *(long *)(*(long *)(in_RDI + 0x18) + (long)in_EDX * 8);
    iVar1 = *(int *)(in_RDI + 8);
    for (local_40 = 0; local_40 < iVar1; local_40 = local_40 + 1) {
      *(undefined4 *)(lVar2 + (long)local_40 * 4) = *(undefined4 *)(lVar4 + (long)local_40 * 4);
    }
    iVar1 = *(int *)(in_RDI + 0xc);
    for (; local_40 < iVar1; local_40 = local_40 + 1) {
      *(undefined4 *)(lVar2 + (long)local_40 * 4) =
           *(undefined4 *)(lVar4 + (long)*(int *)(lVar3 + (long)local_40 * 4) * 4);
    }
    btSolveL1(*(btScalar **)(in_RDI + 0x48),*(btScalar **)(in_RDI + 0x58),*(int *)(in_RDI + 0xc),
              *(int *)(in_RDI + 4));
    lVar2 = *(long *)(in_RDI + 0x60);
    lVar3 = *(long *)(in_RDI + 0x58);
    lVar4 = *(long *)(in_RDI + 0x50);
    iVar1 = *(int *)(in_RDI + 0xc);
    for (local_68 = 0; local_68 < iVar1; local_68 = local_68 + 1) {
      *(float *)(lVar2 + (long)local_68 * 4) =
           *(float *)(lVar3 + (long)local_68 * 4) * *(float *)(lVar4 + (long)local_68 * 4);
    }
    if (in_R8D == 0) {
      B = *(btScalar **)(in_RDI + 0x68);
      lVar2 = *(long *)(in_RDI + 0x60);
      iVar1 = *(int *)(in_RDI + 0xc);
      for (local_80 = 0; local_80 < iVar1; local_80 = local_80 + 1) {
        B[local_80] = *(btScalar *)(lVar2 + (long)local_80 * 4);
      }
      btSolveL1T(*(btScalar **)(in_RDI + 0x48),B,*(int *)(in_RDI + 0xc),*(int *)(in_RDI + 4));
      if (in_ECX < 1) {
        lVar2 = *(long *)(in_RDI + 0x88);
        lVar3 = *(long *)(in_RDI + 0x68);
        iVar1 = *(int *)(in_RDI + 0xc);
        for (local_b0 = 0; local_b0 < iVar1; local_b0 = local_b0 + 1) {
          *(undefined4 *)(in_RSI + (long)*(int *)(lVar2 + (long)local_b0 * 4) * 4) =
               *(undefined4 *)(lVar3 + (long)local_b0 * 4);
        }
      }
      else {
        lVar2 = *(long *)(in_RDI + 0x88);
        lVar3 = *(long *)(in_RDI + 0x68);
        iVar1 = *(int *)(in_RDI + 0xc);
        for (local_98 = 0; local_98 < iVar1; local_98 = local_98 + 1) {
          *(uint *)(in_RSI + (long)*(int *)(lVar2 + (long)local_98 * 4) * 4) =
               *(uint *)(lVar3 + (long)local_98 * 4) ^ 0x80000000;
        }
      }
    }
  }
  return;
}

Assistant:

void btLCP::solve1 (btScalar *a, int i, int dir, int only_transfer)
{
  // the `Dell' and `ell' that are computed here are saved. if index i is
  // later added to the factorization then they can be reused.
  //
  // @@@ question: do we need to solve for entire delta_x??? yes, but
  //     only if an x goes below 0 during the step.

  if (m_nC > 0) {
    {
      btScalar *Dell = m_Dell;
      int *C = m_C;
      btScalar *aptr = BTAROW(i);
#   ifdef BTNUB_OPTIMIZATIONS
      // if nub>0, initial part of aptr[] is guaranteed unpermuted
      const int nub = m_nub;
      int j=0;
      for ( ; j<nub; ++j) Dell[j] = aptr[j];
      const int nC = m_nC;
      for ( ; j<nC; ++j) Dell[j] = aptr[C[j]];
#   else
      const int nC = m_nC;
      for (int j=0; j<nC; ++j) Dell[j] = aptr[C[j]];
#   endif
    }
    btSolveL1 (m_L,m_Dell,m_nC,m_nskip);
    {
      btScalar *ell = m_ell, *Dell = m_Dell, *d = m_d;
      const int nC = m_nC;
      for (int j=0; j<nC; ++j) ell[j] = Dell[j] * d[j];
    }

    if (!only_transfer) {
      btScalar *tmp = m_tmp, *ell = m_ell;
      {
        const int nC = m_nC;
        for (int j=0; j<nC; ++j) tmp[j] = ell[j];
      }
      btSolveL1T (m_L,tmp,m_nC,m_nskip);
      if (dir > 0) {
        int *C = m_C;
        btScalar *tmp = m_tmp;
        const int nC = m_nC;
        for (int j=0; j<nC; ++j) a[C[j]] = -tmp[j];
      } else {
        int *C = m_C;
        btScalar *tmp = m_tmp;
        const int nC = m_nC;
        for (int j=0; j<nC; ++j) a[C[j]] = tmp[j];
      }
    }
  }
}